

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
Analyser_removeExternalVariableByIndex_Test::~Analyser_removeExternalVariableByIndex_Test
          (Analyser_removeExternalVariableByIndex_Test *this)

{
  Analyser_removeExternalVariableByIndex_Test *this_local;
  
  ~Analyser_removeExternalVariableByIndex_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Analyser, removeExternalVariableByIndex)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    EXPECT_FALSE(analyser->removeExternalVariable(0));

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V")));

    EXPECT_TRUE(analyser->removeExternalVariable(0));
    EXPECT_FALSE(analyser->removeExternalVariable(1));
}